

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
::push_back(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            *this,value_type *val)

{
  pointer *ppuVar1;
  binary_t *pbVar2;
  type_error *__return_storage_ptr__;
  char *__s;
  size_t sVar3;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (this->m_type == null) {
    this->m_type = object;
    pbVar2 = (binary_t *)operator_new(0x30);
    ppuVar1 = &(pbVar2->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    (pbVar2->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pbVar2->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pbVar2->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pbVar2->m_subtype = (subtype_type)ppuVar1;
    *(pointer **)&pbVar2->m_has_subtype = ppuVar1;
    pbVar2[1].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->m_value).binary = pbVar2;
    assert_invariant(this,true);
  }
  else if (this->m_type != object) {
    __return_storage_ptr__ = (type_error *)__cxa_allocate_exception(0x20);
    __s = type_name(this);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    sVar3 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,__s,__s + sVar3);
    std::operator+(&local_48,"cannot use push_back() with ",&local_68);
    detail::type_error::
    create<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (__return_storage_ptr__,(type_error *)0x134,(int)&local_48,(string *)this,in_R8);
    __cxa_throw(__return_storage_ptr__,&detail::type_error::typeinfo,detail::exception::~exception);
  }
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
  ::
  _M_insert_unique<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>const&>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
              *)(this->m_value).object,val);
  return;
}

Assistant:

void push_back(const typename object_t::value_type& val)
    {
        // push_back only works for null objects or objects
        if (JSON_HEDLEY_UNLIKELY(!(is_null() || is_object())))
        {
            JSON_THROW(type_error::create(308, "cannot use push_back() with " + std::string(type_name()), *this));
        }

        // transform null object into an object
        if (is_null())
        {
            m_type = value_t::object;
            m_value = value_t::object;
            assert_invariant();
        }

        // add element to object
        auto res = m_value.object->insert(val);
        set_parent(res.first->second);
    }